

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

void __thiscall ncnn::Convolution::Convolution(Convolution *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_fffffffffffffee0;
  
  Layer::Layer(in_stack_fffffffffffffee0);
  *in_RDI = &PTR__Convolution_01fc1390;
  in_RDI[0x22] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  *(undefined4 *)(in_RDI + 0x25) = 0;
  in_RDI[0x26] = 0;
  *(undefined4 *)(in_RDI + 0x27) = 0;
  *(undefined4 *)((long)in_RDI + 0x13c) = 0;
  *(undefined4 *)(in_RDI + 0x28) = 0;
  *(undefined4 *)((long)in_RDI + 0x144) = 0;
  *(undefined4 *)(in_RDI + 0x29) = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  *(undefined4 *)(in_RDI + 0x2f) = 0;
  in_RDI[0x30] = 0;
  *(undefined4 *)(in_RDI + 0x31) = 0;
  *(undefined4 *)((long)in_RDI + 0x18c) = 0;
  *(undefined4 *)(in_RDI + 0x32) = 0;
  *(undefined4 *)((long)in_RDI + 0x194) = 0;
  *(undefined4 *)(in_RDI + 0x33) = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x37] = 0;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  in_RDI[0x39] = 0;
  *(undefined4 *)(in_RDI + 0x3a) = 0;
  *(undefined4 *)((long)in_RDI + 0x1d4) = 0;
  *(undefined4 *)(in_RDI + 0x3b) = 0;
  *(undefined4 *)((long)in_RDI + 0x1dc) = 0;
  *(undefined4 *)(in_RDI + 0x3c) = 0;
  in_RDI[0x3d] = 0;
  in_RDI[0x3e] = 0;
  in_RDI[0x3f] = 0;
  in_RDI[0x40] = 0;
  *(undefined4 *)(in_RDI + 0x41) = 0;
  in_RDI[0x42] = 0;
  *(undefined4 *)(in_RDI + 0x43) = 0;
  *(undefined4 *)((long)in_RDI + 0x21c) = 0;
  *(undefined4 *)(in_RDI + 0x44) = 0;
  *(undefined4 *)((long)in_RDI + 0x224) = 0;
  *(undefined4 *)(in_RDI + 0x45) = 0;
  in_RDI[0x46] = 0;
  in_RDI[0x47] = 0;
  in_RDI[0x48] = 0;
  in_RDI[0x49] = 0;
  *(undefined4 *)(in_RDI + 0x4a) = 0;
  in_RDI[0x4b] = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 0;
  *(undefined4 *)((long)in_RDI + 0x264) = 0;
  *(undefined4 *)(in_RDI + 0x4d) = 0;
  *(undefined4 *)((long)in_RDI + 0x26c) = 0;
  *(undefined4 *)(in_RDI + 0x4e) = 0;
  in_RDI[0x4f] = 0;
  in_RDI[0x50] = 0;
  in_RDI[0x51] = 0;
  in_RDI[0x52] = 0;
  *(undefined4 *)(in_RDI + 0x53) = 0;
  in_RDI[0x54] = 0;
  *(undefined4 *)(in_RDI + 0x55) = 0;
  *(undefined4 *)((long)in_RDI + 0x2ac) = 0;
  *(undefined4 *)(in_RDI + 0x56) = 0;
  *(undefined4 *)((long)in_RDI + 0x2b4) = 0;
  *(undefined4 *)(in_RDI + 0x57) = 0;
  in_RDI[0x58] = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

Convolution::Convolution()
{
    one_blob_only = true;
    support_inplace = false;
}